

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<QListViewItem>::emplace<QListViewItem_const&>
          (QPodArrayOps<QListViewItem> *this,qsizetype i,QListViewItem *args)

{
  QListViewItem **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  uint uVar10;
  QListViewItem *pQVar11;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QListViewItem>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00584fd5:
    iVar9 = args->indexHint;
    uVar10 = args->visited;
    sVar7 = args->w;
    sVar8 = args->h;
    iVar5 = args->x;
    iVar6 = args->y;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QListViewItem>).size != 0);
    QArrayDataPointer<QListViewItem>::detachAndGrow
              (&this->super_QArrayDataPointer<QListViewItem>,where,1,(QListViewItem **)0x0,
               (QArrayDataPointer<QListViewItem> *)0x0);
    pQVar11 = createHole(this,where,i,1);
    pQVar11->x = iVar5;
    pQVar11->y = iVar6;
    pQVar11->w = sVar7;
    pQVar11->h = sVar8;
    pQVar11->indexHint = iVar9;
    pQVar11->visited = uVar10;
  }
  else {
    lVar4 = (this->super_QArrayDataPointer<QListViewItem>).size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc - lVar4 !=
        ((long)((long)(this->super_QArrayDataPointer<QListViewItem>).ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) *
        -0x3333333333333333)) {
      pQVar11 = (this->super_QArrayDataPointer<QListViewItem>).ptr;
      pQVar11[lVar4].visited = args->visited;
      iVar5 = args->y;
      sVar7 = args->w;
      sVar8 = args->h;
      iVar6 = args->indexHint;
      pQVar11 = pQVar11 + lVar4;
      pQVar11->x = args->x;
      pQVar11->y = iVar5;
      pQVar11->w = sVar7;
      pQVar11->h = sVar8;
      pQVar11->indexHint = iVar6;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QListViewItem *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<QListViewItem>).ptr)) goto LAB_00584fd5;
      pQVar11 = (this->super_QArrayDataPointer<QListViewItem>).ptr;
      pQVar11[-1].visited = args->visited;
      iVar5 = args->y;
      sVar7 = args->w;
      sVar8 = args->h;
      iVar6 = args->indexHint;
      pQVar11[-1].x = args->x;
      pQVar11[-1].y = iVar5;
      pQVar11[-1].w = sVar7;
      pQVar11[-1].h = sVar8;
      pQVar11[-1].indexHint = iVar6;
      ppQVar1 = &(this->super_QArrayDataPointer<QListViewItem>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QListViewItem>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }